

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoffscreenintegration_x11.cpp
# Opt level: O2

void __thiscall QOffscreenX11GLXContext::~QOffscreenX11GLXContext(QOffscreenX11GLXContext *this)

{
  QOffscreenX11GLXContextData *pQVar1;
  
  *(undefined ***)this = &PTR__QOffscreenX11GLXContext_0011d5a8;
  *(undefined ***)&this->super_QGLXContext = &PTR__QOffscreenX11GLXContext_0011d628;
  pQVar1 = (this->d).d;
  glXDestroyContext(pQVar1->x11->m_connection->m_display,pQVar1->context);
  pQVar1 = (this->d).d;
  XDestroyWindow(pQVar1->x11->m_connection->m_display,pQVar1->window);
  QScopedPointer<QOffscreenX11GLXContextData,_QScopedPointerDeleter<QOffscreenX11GLXContextData>_>::
  ~QScopedPointer(&this->d);
  QNativeInterface::QGLXContext::~QGLXContext(&this->super_QGLXContext);
  QPlatformOpenGLContext::~QPlatformOpenGLContext(&this->super_QPlatformOpenGLContext);
  return;
}

Assistant:

QOffscreenX11GLXContext::~QOffscreenX11GLXContext()
{
    glXDestroyContext(d->x11->display(), d->context);
    XDestroyWindow(d->x11->display(), d->window);
}